

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  long *plVar1;
  U32 UVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  uint h;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  
  pBVar3 = (ms->window).base;
  uVar7 = (ms->cParams).chainLog;
  uVar24 = 1 << ((byte)uVar7 & 0x1f);
  uVar27 = ms->nextToUpdate;
  uVar15 = (ulong)uVar27;
  uVar16 = (uint)((long)ip - (long)pBVar3);
  uVar6 = uVar16 - uVar24;
  if (uVar16 - uVar27 <= uVar24) {
    uVar6 = uVar27;
  }
  uVar14 = (1 << ((byte)(ms->cParams).searchLog & 0x1f)) - 3;
  if (0xfe < uVar14) {
    uVar14 = 0xff;
  }
  uVar21 = (ms->cParams).hashLog;
  h = uVar21 - 2;
  bVar10 = (byte)h;
  lVar23 = 1L << (bVar10 & 0x3f);
  uVar20 = 3 << (bVar10 & 0x1f);
  uVar26 = uVar16 - uVar20;
  if (uVar16 < uVar20 || uVar26 == 0) {
    uVar26 = uVar27;
  }
  if (0x18 < uVar7) {
    __assert_fail("ms->cParams.chainLog <= 24",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x751f,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar21 <= uVar7) {
    __assert_fail("ms->cParams.hashLog > ms->cParams.chainLog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7520,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar15 == 0) {
    __assert_fail("idx != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7521,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  if (uVar6 < uVar26) {
    __assert_fail("tmpMinChain <= minChain",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7522,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  pUVar4 = ms->hashTable;
  pUVar5 = ms->chainTable;
  bVar11 = 0x42 - (char)uVar21;
  bVar12 = 0x22 - (char)uVar21;
  uVar13 = (long)ip - (long)pBVar3 & 0xffffffff;
  for (; uVar15 < uVar13; uVar15 = uVar15 + 1) {
    if (0x20 < h) goto LAB_0016597e;
    plVar1 = (long *)(pBVar3 + uVar15);
    switch((ms->cParams).minMatch) {
    case 5:
      uVar8 = *plVar1 * -0x30e4432345000000;
      goto LAB_00165734;
    case 6:
      sVar9 = ZSTD_hash6Ptr(plVar1,h);
      uVar7 = (uint)sVar9;
      break;
    case 7:
      uVar8 = *plVar1 * -0x30e44323405a9d00;
LAB_00165734:
      uVar7 = (uint)(uVar8 >> (bVar11 & 0x3f));
      break;
    case 8:
      sVar9 = ZSTD_hash8Ptr(plVar1,h);
      uVar7 = (uint)sVar9;
      break;
    default:
      uVar7 = (uint)((int)*plVar1 * -0x61c8864f) >> (bVar12 & 0x1f);
    }
    if (uVar26 <= uVar15) {
      pUVar4[lVar23 + (ulong)((U32)uVar15 - uVar26)] = pUVar4[uVar7];
    }
    pUVar4[uVar7] = (U32)uVar15;
  }
  uVar7 = 1 << (bVar10 & 0x1f);
  uVar8 = (ulong)uVar7;
  uVar27 = 0;
  for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
    uVar20 = 0;
    uVar21 = 0;
    puVar19 = pUVar4 + uVar15;
    while( true ) {
      uVar22 = *puVar19;
      if ((uVar22 < uVar26) || (2 < uVar20)) break;
      uVar21 = uVar21 + (uVar22 < uVar6);
      puVar19 = pUVar4 + lVar23 + (ulong)(uVar22 - uVar26);
      uVar20 = uVar20 + 1;
    }
    uVar18 = 0;
    uVar25 = uVar27;
    if (uVar20 == 3) {
      uVar17 = 0;
      uVar20 = uVar27;
      while( true ) {
        uVar18 = uVar14;
        uVar25 = uVar20;
        if ((uVar14 == uVar17) ||
           ((uVar25 = uVar27 + uVar17, uVar22 < uVar6 &&
            ((uVar18 = uVar17, uVar22 == 0 || (uVar21 = uVar21 + 1, 3 < uVar21))))))
        goto LAB_00165825;
        uVar20 = uVar20 + 1;
        pUVar5[uVar25] = uVar22;
        if (uVar22 < uVar26) break;
        uVar22 = pUVar4[lVar23 + (ulong)(uVar22 - uVar26)];
        uVar17 = uVar17 + 1;
      }
      uVar18 = uVar17 + 1;
      uVar25 = uVar20;
    }
LAB_00165825:
    uVar27 = uVar25;
    uVar21 = uVar27 * 0x100 + uVar18 * -0xff;
    if (uVar18 == 0) {
      uVar21 = 0;
    }
    pUVar4[uVar15] = uVar21;
  }
  if (uVar24 < uVar27) {
    __assert_fail("chainPos <= chainSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x755b,
                  "void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *, const BYTE *const)"
                 );
  }
  uVar7 = uVar7 * 4;
  while( true ) {
    uVar7 = uVar7 - 4;
    iVar28 = (int)uVar8;
    uVar27 = iVar28 - 1;
    uVar8 = (ulong)uVar27;
    if (iVar28 == 0) break;
    UVar2 = pUVar4[uVar8];
    for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
      pUVar4[(ulong)uVar7 + lVar23] = 0;
    }
    pUVar4[(ulong)(uVar27 * 4) + 3] = UVar2;
  }
  uVar15 = (ulong)ms->nextToUpdate;
  do {
    if (uVar13 <= uVar15) {
      ms->nextToUpdate = uVar16;
      return;
    }
    if (0x20 < h) {
LAB_0016597e:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    plVar1 = (long *)(pBVar3 + uVar15);
    switch((ms->cParams).minMatch) {
    case 5:
      uVar8 = *plVar1 * -0x30e4432345000000;
      goto LAB_001658fa;
    case 6:
      sVar9 = ZSTD_hash6Ptr(plVar1,h);
      uVar7 = (uint)sVar9;
      break;
    case 7:
      uVar8 = *plVar1 * -0x30e44323405a9d00;
LAB_001658fa:
      uVar7 = (uint)(uVar8 >> (bVar11 & 0x3f));
      break;
    case 8:
      sVar9 = ZSTD_hash8Ptr(plVar1,h);
      uVar7 = (uint)sVar9;
      break;
    default:
      uVar7 = (uint)((int)*plVar1 * -0x61c8864f) >> (bVar12 & 0x1f);
    }
    for (lVar23 = 0; lVar23 != -2; lVar23 = lVar23 + -1) {
      pUVar4[(ulong)(uVar7 & 0x3fffffff) * 4 + lVar23 + 2] = pUVar4[uVar7 * 4 + 1 + (int)lVar23];
    }
    pUVar4[uVar7 * 4] = (U32)uVar15;
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target - idx ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = (U32)((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}